

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_94447::JsonBoolean::JsonBoolean(JsonBoolean *this)

{
  JsonBoolean *this_local;
  
  Json::Json(&this->super_Json);
  (this->super_Json).super_Test._vptr_Test = (_func_int **)&PTR__JsonBoolean_00259aa8;
  testing::StrictMock<mock_json_callbacks>::StrictMock(&this->callbacks_);
  callbacks_proxy<mock_json_callbacks>::callbacks_proxy
            (&this->proxy_,&(this->callbacks_).super_mock_json_callbacks);
  return;
}

Assistant:

JsonBoolean ()
                : proxy_{callbacks_} {}